

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zeEventPoolOpenIpcHandle
          (ze_context_handle_t hContext,ze_ipc_event_pool_handle_t hIpc,
          ze_event_pool_handle_t *phEventPool)

{
  code *pcVar1;
  ze_event_pool_handle_t p_Var2;
  undefined1 local_68 [64];
  code *local_28;
  ze_pfnEventPoolOpenIpcHandle_t pfnOpenIpcHandle;
  ze_event_pool_handle_t *pp_Stack_18;
  ze_result_t result;
  ze_event_pool_handle_t *phEventPool_local;
  ze_context_handle_t hContext_local;
  
  pcVar1 = DAT_0011c5a8;
  pfnOpenIpcHandle._4_4_ = ZE_RESULT_SUCCESS;
  local_28 = DAT_0011c5a8;
  pp_Stack_18 = phEventPool;
  phEventPool_local = (ze_event_pool_handle_t *)hContext;
  if (DAT_0011c5a8 == (code *)0x0) {
    p_Var2 = (ze_event_pool_handle_t)context_t::get((context_t *)&context);
    *pp_Stack_18 = p_Var2;
  }
  else {
    memcpy(local_68,&hIpc,0x40);
    pfnOpenIpcHandle._4_4_ = (*pcVar1)(hContext,pp_Stack_18);
  }
  return pfnOpenIpcHandle._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeEventPoolOpenIpcHandle(
        ze_context_handle_t hContext,                   ///< [in] handle of the context object to associate with the IPC event pool
                                                        ///< handle
        ze_ipc_event_pool_handle_t hIpc,                ///< [in] IPC event pool handle
        ze_event_pool_handle_t* phEventPool             ///< [out] pointer handle of event pool object created
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnOpenIpcHandle = context.zeDdiTable.EventPool.pfnOpenIpcHandle;
        if( nullptr != pfnOpenIpcHandle )
        {
            result = pfnOpenIpcHandle( hContext, hIpc, phEventPool );
        }
        else
        {
            // generic implementation
            *phEventPool = reinterpret_cast<ze_event_pool_handle_t>( context.get() );

        }

        return result;
    }